

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_8::LoadableGetStateBlock_x
          (ChElementHexaCorot_8 *this,int block_offset,ChState *mD)

{
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_78;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAbase + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)block_offset,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->super_ChNodeFEAbase + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 3),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->super_ChNodeFEAbase + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 6),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->super_ChNodeFEAbase + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 9),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->super_ChNodeFEAbase + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 0xc),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->super_ChNodeFEAbase + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 0xf),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[6].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->super_ChNodeFEAbase + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 0x12),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[7].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->super_ChNodeFEAbase + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 0x15),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  return;
}

Assistant:

void ChElementHexaCorot_8::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 6, 3) = nodes[2]->GetPos().eigen();
    mD.segment(block_offset + 9, 3) = nodes[3]->GetPos().eigen();
    mD.segment(block_offset + 12, 3) = nodes[4]->GetPos().eigen();
    mD.segment(block_offset + 15, 3) = nodes[5]->GetPos().eigen();
    mD.segment(block_offset + 18, 3) = nodes[6]->GetPos().eigen();
    mD.segment(block_offset + 21, 3) = nodes[7]->GetPos().eigen();
}